

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_mips.cpp
# Opt level: O0

void __thiscall vmips::address::output(address *this,ostream *out)

{
  element_type *peVar1;
  ostream *poVar2;
  element_type *peVar3;
  ostream *out_local;
  address *this_local;
  
  peVar1 = std::__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data);
  if (peVar1->status == Undetermined) {
    poVar2 = std::operator<<(out,"li ");
    peVar3 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_Unary).target);
    poVar2 = operator<<(poVar2,peVar3);
    poVar2 = std::operator<<(poVar2,", ");
    std::operator<<(poVar2,"<stack_offset>");
  }
  else {
    poVar2 = std::operator<<(out,"li ");
    peVar3 = std::__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator*((__shared_ptr_access<vmips::VirtReg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)&(this->super_Unary).target);
    poVar2 = operator<<(poVar2,peVar3);
    poVar2 = std::operator<<(poVar2,", ");
    peVar1 = std::
             __shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<vmips::MemoryLocation,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->data);
    std::ostream::operator<<(poVar2,peVar1->offset);
  }
  return;
}

Assistant:

void address::output(std::ostream &out) const {
    if (data->status != MemoryLocation::Undetermined) {
        out << "li " << *this->target << ", " << data->offset;
    } else {
        out << "li " << *this->target << ", " << "<stack_offset>";
    }
}